

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O1

Fraig_Node_t *
Fraig_NodeRecognizeMux(Fraig_Node_t *pNode,Fraig_Node_t **ppNodeT,Fraig_Node_t **ppNodeE)

{
  ulong *puVar1;
  Fraig_Node_t *pFVar2;
  Fraig_Node_t *pFVar3;
  int iVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  Fraig_Node_t *pFVar10;
  Fraig_Node_t *pFVar11;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigUtil.c"
                  ,0x295,
                  "Fraig_Node_t *Fraig_NodeRecognizeMux(Fraig_Node_t *, Fraig_Node_t **, Fraig_Node_t **)"
                 );
  }
  iVar4 = Fraig_NodeIsMuxType(pNode);
  if (iVar4 != 0) {
    uVar6 = (ulong)pNode->p1 & 0xfffffffffffffffe;
    uVar8 = (ulong)pNode->p2 & 0xfffffffffffffffe;
    puVar7 = (ulong *)(uVar6 + 0x20);
    pFVar2 = *(Fraig_Node_t **)(uVar6 + 0x20);
    puVar1 = (ulong *)(uVar8 + 0x20);
    pFVar10 = (Fraig_Node_t *)(*(ulong *)(uVar8 + 0x20) ^ 1);
    puVar5 = puVar7;
    if (pFVar2 == pFVar10) {
      if (((ulong)pFVar2 & 1) == 0) {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar6 + 0x28) ^ 1);
        puVar7 = (ulong *)(uVar8 + 0x28);
      }
      else {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar8 + 0x28) ^ 1);
        puVar5 = puVar1;
        puVar7 = (ulong *)(uVar6 + 0x28);
      }
    }
    else {
      puVar9 = (ulong *)(uVar8 + 0x28);
      pFVar11 = (Fraig_Node_t *)(*(ulong *)(uVar8 + 0x28) ^ 1);
      if (pFVar2 == pFVar11) {
        if (((ulong)pFVar2 & 1) == 0) {
          *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar6 + 0x28) ^ 1);
          puVar7 = puVar1;
        }
        else {
          *ppNodeT = pFVar10;
          puVar7 = (ulong *)(uVar6 + 0x28);
          puVar5 = puVar9;
        }
      }
      else {
        pFVar3 = *(Fraig_Node_t **)(uVar6 + 0x28);
        puVar5 = (ulong *)(uVar6 + 0x28);
        if (pFVar3 == pFVar10) {
          if (((ulong)pFVar3 & 1) == 0) {
            *ppNodeT = (Fraig_Node_t *)((ulong)pFVar2 ^ 1);
            puVar7 = puVar9;
          }
          else {
            *ppNodeT = pFVar11;
            puVar5 = puVar1;
          }
        }
        else {
          if (pFVar3 != pFVar11) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigUtil.c"
                          ,0x2d7,
                          "Fraig_Node_t *Fraig_NodeRecognizeMux(Fraig_Node_t *, Fraig_Node_t **, Fraig_Node_t **)"
                         );
          }
          if (((ulong)pFVar3 & 1) == 0) {
            *ppNodeT = (Fraig_Node_t *)((ulong)pFVar2 ^ 1);
            puVar7 = puVar1;
          }
          else {
            *ppNodeT = pFVar10;
            puVar5 = puVar9;
          }
        }
      }
    }
    *ppNodeE = (Fraig_Node_t *)(*puVar7 ^ 1);
    return (Fraig_Node_t *)*puVar5;
  }
  __assert_fail("Fraig_NodeIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigUtil.c"
                ,0x296,
                "Fraig_Node_t *Fraig_NodeRecognizeMux(Fraig_Node_t *, Fraig_Node_t **, Fraig_Node_t **)"
               );
}

Assistant:

Fraig_Node_t * Fraig_NodeRecognizeMux( Fraig_Node_t * pNode, Fraig_Node_t ** ppNodeT, Fraig_Node_t ** ppNodeE )
{
    Fraig_Node_t * pNode1, * pNode2;
    assert( !Fraig_IsComplement(pNode) );
    assert( Fraig_NodeIsMuxType(pNode) );
    // get children
    pNode1 = Fraig_Regular(pNode->p1);
    pNode2 = Fraig_Regular(pNode->p2);
    // find the control variable
    if ( pNode1->p1 == Fraig_Not(pNode2->p1) )
    {
        if ( Fraig_IsComplement(pNode1->p1) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p2);
            *ppNodeE = Fraig_Not(pNode1->p2);
            return pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p2);
            *ppNodeE = Fraig_Not(pNode2->p2);
            return pNode1->p1;
        }
    }
    else if ( pNode1->p1 == Fraig_Not(pNode2->p2) )
    {
        if ( Fraig_IsComplement(pNode1->p1) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p1);
            *ppNodeE = Fraig_Not(pNode1->p2);
            return pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p2);
            *ppNodeE = Fraig_Not(pNode2->p1);
            return pNode1->p1;
        }
    }
    else if ( pNode1->p2 == Fraig_Not(pNode2->p1) )
    {
        if ( Fraig_IsComplement(pNode1->p2) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p2);
            *ppNodeE = Fraig_Not(pNode1->p1);
            return pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p1);
            *ppNodeE = Fraig_Not(pNode2->p2);
            return pNode1->p2;
        }
    }
    else if ( pNode1->p2 == Fraig_Not(pNode2->p2) )
    {
        if ( Fraig_IsComplement(pNode1->p2) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p1);
            *ppNodeE = Fraig_Not(pNode1->p1);
            return pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p1);
            *ppNodeE = Fraig_Not(pNode2->p1);
            return pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}